

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::ChangeTraceConfigResponse>::Deferred
          (Deferred<perfetto::protos::gen::ChangeTraceConfigResponse> *this,DeferredBase *other)

{
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> local_38;
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *local_18;
  DeferredBase *other_local;
  Deferred<perfetto::protos::gen::ChangeTraceConfigResponse> *this_local;
  
  local_18 = &other->callback_;
  other_local = &this->super_DeferredBase;
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::function
            (&local_38,(nullptr_t)0x0);
  DeferredBase::DeferredBase(&this->super_DeferredBase,&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function(&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::operator=
            ((function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)this,local_18)
  ;
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::operator=
            (local_18,(nullptr_t)0x0);
  return;
}

Assistant:

explicit Deferred(DeferredBase&& other) {
    callback_ = std::move(other.callback_);
    other.callback_ = nullptr;
  }